

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyStencilMaskInitial
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,int stencilBits)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long *data;
  ulong *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1c0;
  ulong local_40;
  GLint64 reference;
  StateQueryMemoryWriteGuard<long> state;
  int stencilBits_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  state.m_postguard._0_4_ = stencilBits;
  state.m_postguard._4_4_ = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)&reference);
  pname = state.m_postguard._4_4_;
  data = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                   ((StateQueryMemoryWriteGuard<long> *)&reference);
  glu::CallLogWrapper::glGetInteger64v(&(this->super_StateVerifier).super_CallLogWrapper,pname,data)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)&reference,testCtx);
  if (bVar1) {
    local_40 = (1L << ((byte)(int)state.m_postguard & 0x3f)) - 1;
    puVar3 = (ulong *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                                ((StateQueryMemoryWriteGuard *)&reference);
    if ((*puVar3 & local_40) != local_40) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1c0,(char (*) [36])"// ERROR: expected mimimum mask of ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(long *)&local_40);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(StateQueryMemoryWriteGuard<long> *)&reference);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid mask value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyStencilMaskInitial (tcu::TestContext& testCtx, GLenum name, int stencilBits)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLint64 reference = (1ULL << stencilBits) - 1;

	if ((state & reference) != reference) // the least significant stencilBits bits should be on
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected mimimum mask of " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid mask value");
	}
}